

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing segment operators");
  std::endl<char,std::char_traits<char>>(poVar2);
  segment_operator();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing word boundary");
  std::endl<char,std::char_traits<char>>(poVar2);
  word_boundary();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing character boundary");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_boundaries(character_abi_cxx11_,nones,(int *)0x0,character);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing sentence boundary");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_boundaries(sentence1_abi_cxx11_,sentence1a,sentence1b,sentence);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing line boundary");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_boundaries(line1_abi_cxx11_,line1a,line1b,line);
  iVar3 = test_counter - error_counter;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
  poVar2 = std::operator<<(poVar2," tests");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (0 < error_counter) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,error_counter);
    poVar2 = std::operator<<(poVar2," tests");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout," ");
  lVar1 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar2 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  poVar2 = std::operator<<(poVar2,"% of tests completed sucsessefully");
  std::endl<char,std::char_traits<char>>(poVar2);
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        std::cout << "Testing segment operators" << std::endl;
        segment_operator();
        std::cout << "Testing word boundary" << std::endl;
        word_boundary();
        std::cout << "Testing character boundary" << std::endl;
        test_boundaries(character,nones,0,lb::character);
        std::cout << "Testing sentence boundary" << std::endl;
        test_boundaries(sentence1,sentence1a,sentence1b,lb::sentence);
        std::cout << "Testing line boundary" << std::endl;
        test_boundaries(line1,line1a,line1b,lb::line);
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}